

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O1

TestConfig_conflict *
vkt::memory::anon_unknown_0::subMappedConfig
          (TestConfig_conflict *__return_storage_ptr__,VkDeviceSize allocationSize,
          MemoryRange *mapping,Op op,deUint32 seed)

{
  VkDeviceSize VVar1;
  VkDeviceSize VVar2;
  VkDeviceSize VVar3;
  VkDeviceSize VVar4;
  pointer pMVar5;
  pointer pMVar6;
  ulong uVar7;
  pointer pMVar8;
  undefined4 uStack_84;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_70;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  vStack_58;
  bool local_40;
  value_type local_38;
  
  vStack_58.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_58.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_58.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  VVar3 = mapping->offset;
  VVar4 = mapping->size;
  local_40 = false;
  if (OP_BUFFER_BINDMEMORY < op) {
    __return_storage_ptr__->allocationSize = 0xffffffffffffffff;
    *(undefined4 *)&(__return_storage_ptr__->mapping).offset = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->mapping).offset + 4) = 0xffffffff;
    *(undefined4 *)&(__return_storage_ptr__->mapping).size = 0xffffffff;
    *(undefined4 *)((long)&(__return_storage_ptr__->mapping).size + 4) = 0xffffffff;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  switch(op) {
  case OP_MAP:
    (__return_storage_ptr__->mapping).offset = VVar3;
    (__return_storage_ptr__->mapping).size = VVar4;
    __return_storage_ptr__->allocationSize = allocationSize;
    *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_84,seed);
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->remap = false;
    return __return_storage_ptr__;
  case OP_FLUSH:
    VVar2 = mapping->offset;
    VVar1 = mapping->size;
    pMVar6 = (pointer)operator_new(0x10);
    pMVar6->offset = VVar2;
    pMVar6->size = VVar1;
    pMVar8 = local_70.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pMVar5 = local_70.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar6;
    goto LAB_00657516;
  case OP_MAP_FLUSH:
    VVar2 = mapping->offset;
    uVar7 = mapping->size;
    pMVar6 = (pointer)operator_new(0x10);
    pMVar6->offset = (uVar7 >> 2) + VVar2;
    pMVar6->size = uVar7 >> 1;
    pMVar8 = local_70.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pMVar5 = local_70.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar6;
LAB_00657516:
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_70.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_70.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pMVar5 != (pointer)0x0) {
      operator_delete(pMVar5,(long)pMVar8 - (long)pMVar5);
    }
    break;
  case OP_MAP_INVALIDATE:
    uVar7 = mapping->size >> 1;
    local_38.size = mapping->size - uVar7;
    local_38.offset = uVar7 + mapping->offset;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_70,&local_38);
    local_38.offset = mapping->offset;
    local_38.size = mapping->size >> 1;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_70,&local_38);
    break;
  case OP_MAP_READ:
    uVar7 = mapping->size;
    local_38.offset = uVar7 / 3 + mapping->offset;
    local_38.size = uVar7 - (uVar7 >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_70,&local_38);
    local_38.offset = mapping->offset;
    local_38.size = (mapping->size * 2) / 3;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_70,&local_38);
    break;
  case OP_INVALIDATE:
    VVar2 = mapping->offset;
    VVar1 = mapping->size;
    pMVar5 = (pointer)operator_new(0x10);
    pMVar8 = local_70.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar5 + 1;
    pMVar5->offset = VVar2;
    pMVar5->size = VVar1;
    pMVar6 = local_70.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_70.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar7 = (long)local_70.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_70.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_70.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
      ._M_impl.super__Vector_impl_data._M_start = pMVar5;
      local_70.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_70.
           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      operator_delete(pMVar8,uVar7);
      pMVar5 = local_70.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar6 = local_70.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar6;
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar5;
    VVar2 = mapping->offset;
    VVar1 = mapping->size;
    pMVar6 = (pointer)operator_new(0x10);
    pMVar6->offset = VVar2;
    pMVar6->size = VVar1;
    pMVar8 = vStack_58.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pMVar5 = vStack_58.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    vStack_58.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar6;
    goto LAB_0065769d;
  case OP_MAP_MODIFY:
    VVar2 = mapping->offset;
    uVar7 = mapping->size;
    pMVar5 = (pointer)operator_new(0x10);
    pMVar8 = local_70.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar5 + 1;
    pMVar5->offset = (uVar7 >> 2) + VVar2;
    pMVar5->size = uVar7 >> 1;
    pMVar6 = local_70.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_70.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar7 = (long)local_70.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_70.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_70.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
      ._M_impl.super__Vector_impl_data._M_start = pMVar5;
      local_70.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_70.
           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      operator_delete(pMVar8,uVar7);
      pMVar5 = local_70.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar6 = local_70.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar6;
    local_70.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar5;
    VVar2 = mapping->offset;
    uVar7 = mapping->size;
    pMVar6 = (pointer)operator_new(0x10);
    pMVar6->offset = (uVar7 >> 2) + VVar2;
    pMVar6->size = uVar7 >> 1;
    pMVar8 = vStack_58.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pMVar5 = vStack_58.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
             ._M_impl.super__Vector_impl_data._M_start;
    vStack_58.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar6;
LAB_0065769d:
    vStack_58.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         vStack_58.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    vStack_58.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_58.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pMVar5 != (pointer)0x0) {
      operator_delete(pMVar5,(long)pMVar8 - (long)pMVar5);
    }
    (__return_storage_ptr__->mapping).offset = VVar3;
    (__return_storage_ptr__->mapping).size = VVar4;
    __return_storage_ptr__->allocationSize = allocationSize;
    *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_84,seed);
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_70.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_70.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_70.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start =
         vStack_58.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_58.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         vStack_58.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    goto LAB_00657843;
  case OP_BUFFER_CREATE:
    uVar7 = mapping->size >> 1;
    local_38.size = mapping->size - uVar7;
    local_38.offset = uVar7 + mapping->offset;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_70,&local_38);
    local_38.offset = mapping->offset;
    local_38.size = mapping->size >> 1;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_70,&local_38);
    uVar7 = mapping->size >> 1;
    local_38.size = mapping->size - uVar7;
    local_38.offset = uVar7 + mapping->offset;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_58,&local_38);
    local_38.offset = mapping->offset;
    local_38.size = mapping->size >> 1;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_58,&local_38);
    goto LAB_006577df;
  case OP_BUFFER_DESTROY:
    uVar7 = mapping->size;
    local_38.offset = uVar7 / 3 + mapping->offset;
    local_38.size = uVar7 - (uVar7 >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_70,&local_38);
    local_38.offset = mapping->offset;
    local_38.size = (mapping->size * 2) / 3;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&local_70,&local_38);
    uVar7 = mapping->size;
    local_38.offset = uVar7 / 3 + mapping->offset;
    local_38.size = uVar7 - (uVar7 >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_58,&local_38);
    local_38.offset = mapping->offset;
    local_38.size = (mapping->size * 2) / 3;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back(&vStack_58,&local_38);
LAB_006577df:
    (__return_storage_ptr__->mapping).offset = VVar3;
    (__return_storage_ptr__->mapping).size = VVar4;
    __return_storage_ptr__->allocationSize = allocationSize;
    *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_84,seed);
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_70.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_70.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_70.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start =
         vStack_58.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_58.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         vStack_58.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    goto LAB_00657843;
  case OP_BUFFER_BINDMEMORY:
    local_40 = true;
    (__return_storage_ptr__->mapping).offset = VVar3;
    (__return_storage_ptr__->mapping).size = VVar4;
    __return_storage_ptr__->allocationSize = allocationSize;
    *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_84,seed);
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->flushMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->invalidateMappings).
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_00657843;
  }
  (__return_storage_ptr__->mapping).offset = VVar3;
  (__return_storage_ptr__->mapping).size = VVar4;
  __return_storage_ptr__->allocationSize = allocationSize;
  *(ulong *)&__return_storage_ptr__->seed = CONCAT44(uStack_84,seed);
  (__return_storage_ptr__->flushMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->flushMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->flushMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->invalidateMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_start =
       vStack_58.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->invalidateMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       vStack_58.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->invalidateMappings).
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       vStack_58.
       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_00657843:
  __return_storage_ptr__->remap = local_40;
  return __return_storage_ptr__;
}

Assistant:

TestConfig subMappedConfig (VkDeviceSize				allocationSize,
							const MemoryRange&			mapping,
							Op							op,
							deUint32					seed)
{
	TestConfig config;

	config.allocationSize	= allocationSize;
	config.seed				= seed;
	config.mapping			= mapping;
	config.remap			= false;

	switch (op)
	{
		case OP_NONE:
			return config;

		case OP_REMAP:
			config.remap = true;
			return config;

		case OP_FLUSH:
			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			return config;

		case OP_SUB_FLUSH:
			DE_ASSERT(mapping.size / 4 > 0);

			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			return config;

		case OP_SUB_FLUSH_SEPARATE:
			DE_ASSERT(mapping.size / 2 > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			return config;

		case OP_SUB_FLUSH_OVERLAPPING:
			DE_ASSERT((mapping.size / 3) > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			return config;

		case OP_INVALIDATE:
			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			config.invalidateMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			return config;

		case OP_SUB_INVALIDATE:
			DE_ASSERT(mapping.size / 4 > 0);

			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			config.invalidateMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			return config;

		case OP_SUB_INVALIDATE_SEPARATE:
			DE_ASSERT(mapping.size / 2 > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			config.invalidateMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.invalidateMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			return config;

		case OP_SUB_INVALIDATE_OVERLAPPING:
			DE_ASSERT((mapping.size / 3) > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			config.invalidateMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.invalidateMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			return config;

		default:
			DE_FATAL("Unknown Op");
			return TestConfig();
	}
}